

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

CURLcode Curl_cpool_add_waitfds(cpool *cpool,curl_waitfds *cwfds)

{
  Curl_llist_node *pCVar1;
  connectdata *conn_00;
  connectdata *conn;
  easy_pollset ps;
  Curl_llist_node *e;
  CURLcode result;
  curl_waitfds *cwfds_local;
  cpool *cpool_local;
  
  e._4_4_ = CURLE_OK;
  if (cpool != (cpool *)0x0) {
    if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
      Curl_share_lock(cpool->idata,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
    }
    cpool->field_0x98 = cpool->field_0x98 & 0xfe | 1;
  }
  pCVar1 = Curl_llist_head(&cpool->shutdowns);
  if (pCVar1 != (Curl_llist_node *)0x0) {
    for (ps._24_8_ = Curl_llist_head(&cpool->shutdowns); ps._24_8_ != 0;
        ps._24_8_ = Curl_node_next((Curl_llist_node *)ps._24_8_)) {
      conn_00 = (connectdata *)Curl_node_elem((Curl_llist_node *)ps._24_8_);
      memset(&conn,0,0x20);
      Curl_attach_connection(cpool->idata,conn_00);
      Curl_conn_adjust_pollset(cpool->idata,(easy_pollset *)&conn);
      Curl_detach_connection(cpool->idata);
      e._4_4_ = Curl_waitfds_add_ps(cwfds,(easy_pollset *)&conn);
      if (e._4_4_ != CURLE_OK) break;
    }
  }
  if (((cpool != (cpool *)0x0) &&
      (cpool->field_0x98 = cpool->field_0x98 & 0xfe, cpool->share != (Curl_share *)0x0)) &&
     ((cpool->share->specifier & 0x20) != 0)) {
    Curl_share_unlock(cpool->idata,CURL_LOCK_DATA_CONNECT);
  }
  return e._4_4_;
}

Assistant:

CURLcode Curl_cpool_add_waitfds(struct cpool *cpool,
                                struct curl_waitfds *cwfds)
{
  CURLcode result = CURLE_OK;

  CPOOL_LOCK(cpool);
  if(Curl_llist_head(&cpool->shutdowns)) {
    struct Curl_llist_node *e;
    struct easy_pollset ps;
    struct connectdata *conn;

    for(e = Curl_llist_head(&cpool->shutdowns); e;
        e = Curl_node_next(e)) {
      conn = Curl_node_elem(e);
      memset(&ps, 0, sizeof(ps));
      Curl_attach_connection(cpool->idata, conn);
      Curl_conn_adjust_pollset(cpool->idata, &ps);
      Curl_detach_connection(cpool->idata);

      result = Curl_waitfds_add_ps(cwfds, &ps);
      if(result)
        goto out;
    }
  }
out:
  CPOOL_UNLOCK(cpool);
  return result;
}